

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestCheckMacros.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_3cf1::TestCheckArray2DCloseSucceedsOnEqual::TestCheckArray2DCloseSucceedsOnEqual
          (TestCheckArray2DCloseSucceedsOnEqual *this)

{
  char *suiteName;
  TestCheckArray2DCloseSucceedsOnEqual *this_local;
  
  suiteName = UnitTestSuite::GetSuiteName();
  UnitTest::Test::Test
            (&this->super_Test,"CheckArray2DCloseSucceedsOnEqual",suiteName,
             "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/UnitTest++/src/tests/TestCheckMacros.cpp"
             ,0x272);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__TestCheckArray2DCloseSucceedsOnEqual_00183580;
  return;
}

Assistant:

TEST(CheckArray2DCloseSucceedsOnEqual)
{
    bool failure = true;
    {
        RecordingReporter reporter;
        UnitTest::TestResults testResults(&reporter);
		ScopedCurrentTest scopedResults(testResults);

		const float data[2][2] = { {0, 1}, {2, 3} };
        CHECK_ARRAY2D_CLOSE (data, data, 2, 2, 0.01f);

		failure = (testResults.GetFailureCount() > 0);
    }

    CHECK(!failure);
}